

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGeneratorTests.cpp
# Opt level: O3

void __thiscall
solitaire::cards::ShuffledDeckGeneratorTest_generateShuffledDeck_Test::TestBody
          (ShuffledDeckGeneratorTest_generateShuffledDeck_Test *this)

{
  bool bVar1;
  pointer *__ptr_2;
  Card *rhs;
  pointer *__ptr;
  char *message;
  char *in_R9;
  long lVar2;
  Deck generatedDeck;
  Message local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  AssertHelper local_508;
  string local_500 [13];
  AssertHelper local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358 [51];
  Card local_1c0 [52];
  
  ShuffledDeckGenerator::generate
            ((Deck *)local_1c0,&(this->super_ShuffledDeckGeneratorTest).generator);
  lVar2 = 0x198;
  rhs = local_1c0;
  do {
    if (lVar2 == 0) {
      local_360.data_._0_1_ = (internal)0x0;
      local_358[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message(&local_518);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_500,(internal *)&local_360,
                 (AssertionResult *)
                 "std::is_sorted( generatedDeck.begin(), generatedDeck.end(), cardsComparator )",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_508,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
                 ,0x1e,local_500[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_508,&local_518);
      testing::internal::AssertHelper::~AssertHelper(&local_508);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500[0]._M_dataplus._M_p != &local_500[0].field_2) {
        operator_delete(local_500[0]._M_dataplus._M_p,local_500[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((long *)CONCAT71(local_518.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           (char)local_518.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_518.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       (char)local_518.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
      if (local_358[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_358,local_358[0]);
      }
      break;
    }
    bVar1 = anon_unknown_5::cardsComparator(rhs + 1,rhs);
    lVar2 = lVar2 + -8;
    rhs = rhs + 1;
  } while (!bVar1);
  std::
  __introsort_loop<solitaire::cards::Card*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>>
            (local_1c0,(Card *)&stack0xffffffffffffffe0,10,
             (_Iter_comp_iter<bool_(*)(const_solitaire::cards::Card_&,_const_solitaire::cards::Card_&)>
              )0x1acdb5);
  std::
  __final_insertion_sort<solitaire::cards::Card*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(solitaire::cards::Card_const&,solitaire::cards::Card_const&)>>
            (local_1c0,(Card *)&stack0xffffffffffffffe0,
             (_Iter_comp_iter<bool_(*)(const_solitaire::cards::Card_&,_const_solitaire::cards::Card_&)>
              )0x1acdb5);
  createSortedDeck();
  memcpy(local_500,&local_360,0x1a0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>>>
  ::operator()(&local_518,(char *)local_500,(array<solitaire::cards::Card,_52UL> *)"generatedDeck");
  if ((char)local_518.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)local_500);
    if (local_510 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_510->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/cards/ShuffledDeckGeneratorTests.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if ((long *)local_500[0]._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_500[0]._M_dataplus._M_p + 8))();
    }
  }
  if (local_510 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_510,local_510);
  }
  return;
}

Assistant:

TEST_F(ShuffledDeckGeneratorTest, generateShuffledDeck) {
    auto generatedDeck = generator.generate();

    EXPECT_FALSE(std::is_sorted(
        generatedDeck.begin(), generatedDeck.end(), cardsComparator
    ));

    std::sort(generatedDeck.begin(), generatedDeck.end(), cardsComparator);
    EXPECT_THAT(generatedDeck, ContainerEq(createSortedDeck()));
}